

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jason.c
# Opt level: O0

void StartUntil(void)

{
  int iVar1;
  tokentype tokopnd;
  addressrec a;
  addressrec b;
  addressrec op;
  addressrec addr2;
  operandtype otype;
  tokentype relop;
  
  addr2.opndtype = opnnull;
  iVar1 = actionpop();
  tokopnd = actionpop();
  a = getaddress(tokopnd);
  switch(iVar1) {
  case 0x19:
    addr2.opndtype = 0xd;
    break;
  default:
    break;
  case 0x1d:
    addr2.opndtype = 10;
    break;
  case 0x1e:
    addr2.opndtype = 0xc;
    break;
  case 0x1f:
    addr2.opndtype = 0xe;
  }
  b = gettemplabel();
  nextop = genquad(addr2.opndtype,a,b,(addressrec)0x4);
  op.opnd = b.opnd;
  actionpush(op.opnd);
  return;
}

Assistant:

void	StartUntil(void)
{
    enum tokentype		relop;
    enum operandtype	otype = opnnull;
    struct addressrec	addr2, op;
    relop = actionpop();
    op = getaddress(actionpop());
    switch(relop)	{
        case tokgreater:	otype = (enum operandtype)opifposjump; break;
        case tokless:		otype = (enum operandtype)opifnegjump; break;
        case tokequals:		otype = (enum operandtype)opifzjump; break;
        case toknotequal:	otype = (enum operandtype)opifnzjump; break;
        default: break;
    }
    
    addr2 = gettemplabel();
    nextop = genquad((enum optype)otype, op, addr2, no_op);
    actionpush(addr2.opnd);
    
}